

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_released(AMQP_VALUE value,RELEASED_HANDLE *released_handle)

{
  int iVar1;
  int iVar2;
  RELEASED_HANDLE pRVar3;
  AMQP_VALUE pAVar4;
  uint32_t list_item_count;
  uint32_t local_1c;
  
  pRVar3 = (RELEASED_HANDLE)malloc(8);
  if (pRVar3 == (RELEASED_HANDLE)0x0) {
    *released_handle = (RELEASED_HANDLE)0x0;
    iVar2 = 0x465c;
  }
  else {
    pRVar3->composite_value = (AMQP_VALUE)0x0;
    *released_handle = pRVar3;
    pAVar4 = amqpvalue_get_inplace_described_value(value);
    if (pAVar4 == (AMQP_VALUE)0x0) {
      released_destroy(*released_handle);
      iVar2 = 0x4664;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar4,&local_1c);
      iVar2 = 0x466b;
      if (iVar1 == 0) {
        pAVar4 = amqpvalue_clone(value);
        pRVar3->composite_value = pAVar4;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_released(AMQP_VALUE value, RELEASED_HANDLE* released_handle)
{
    int result;
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)released_create_internal();
    *released_handle = released_instance;
    if (*released_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            released_destroy(*released_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {

                    released_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}